

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTest.cxx
# Opt level: O1

cmValue __thiscall cmTest::GetProperty(cmTest *this,string *prop)

{
  bool bVar1;
  cmValue cVar2;
  cmState *this_00;
  
  cVar2 = cmPropertyMap::GetPropertyValue(&this->Properties,prop);
  if (cVar2.Value == (string *)0x0) {
    this_00 = cmMakefile::GetState(this->Makefile);
    bVar1 = cmState::IsPropertyChained(this_00,prop,TEST);
    if ((bVar1) &&
       (cVar2 = cmMakefile::GetProperty(this->Makefile,prop,true), cVar2.Value != (string *)0x0)) {
      return (cmValue)cVar2.Value;
    }
    cVar2.Value = (string *)0x0;
  }
  return (cmValue)cVar2.Value;
}

Assistant:

cmValue cmTest::GetProperty(const std::string& prop) const
{
  cmValue retVal = this->Properties.GetPropertyValue(prop);
  if (!retVal) {
    const bool chain =
      this->Makefile->GetState()->IsPropertyChained(prop, cmProperty::TEST);
    if (chain) {
      if (cmValue p = this->Makefile->GetProperty(prop, chain)) {
        return p;
      }
    }
    return nullptr;
  }
  return retVal;
}